

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.h
# Opt level: O2

base_uint<128UL,_void> __thiscall
jbcoin::STObject::getFieldByValue<jbcoin::STBitString<128ul>,jbcoin::base_uint<128ul,void>>
          (STObject *this,SField *field)

{
  int iVar1;
  STBase *pSVar2;
  _func_int **pp_Var3;
  SField *pSVar4;
  base_uint<128UL,_void> bVar5;
  
  pSVar2 = peekAtPField(this,field);
  if (pSVar2 == (STBase *)0x0) {
    Throw<std::runtime_error,char_const(&)[16]>((char (*) [16])"Field not found");
  }
  iVar1 = (*pSVar2->_vptr_STBase[4])(pSVar2);
  if (iVar1 == 0) {
    pp_Var3 = (_func_int **)0x0;
    pSVar4 = (SField *)0x0;
  }
  else {
    if (pSVar2->_vptr_STBase != (_func_int **)&PTR__STBase_002f9590) {
      Throw<std::runtime_error,char_const(&)[17]>((char (*) [17])"Wrong field type");
    }
    pp_Var3 = pSVar2[1]._vptr_STBase;
    pSVar4 = pSVar2[1].fName;
  }
  bVar5.pn._8_8_ = pSVar4;
  bVar5.pn._0_8_ = pp_Var3;
  return (base_uint<128UL,_void>)bVar5.pn;
}

Assistant:

V getFieldByValue (SField const& field) const
    {
        const STBase* rf = peekAtPField (field);

        if (! rf)
            Throw<std::runtime_error> ("Field not found");

        SerializedTypeID id = rf->getSType ();

        if (id == STI_NOTPRESENT)
            return V (); // optional field not present

        const T* cf = dynamic_cast<const T*> (rf);

        if (! cf)
            Throw<std::runtime_error> ("Wrong field type");

        return cf->value ();
    }